

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O3

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  secp256k1_gej *psVar5;
  long lVar6;
  secp256k1_gej *psVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  secp256k1_scalar local_a0;
  secp256k1_ge local_80;
  
  psVar5 = &ctx->initial;
  psVar7 = r;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    (psVar7->x).n[0] = (psVar5->x).n[0];
    psVar5 = (secp256k1_gej *)((psVar5->x).n + 1);
    psVar7 = (secp256k1_gej *)((psVar7->x).n + 1);
  }
  secp256k1_scalar_add(&local_a0,gn,&ctx->blind);
  local_80.infinity = 0;
  lVar2 = 0x231ff0;
  auVar13 = (undefined1  [16])0x0;
  uVar8 = 0;
  auVar14 = (undefined1  [16])0x0;
  auVar16 = (undefined1  [16])0x0;
  auVar15 = (undefined1  [16])0x0;
  do {
    uVar3 = 0;
    do {
      uVar4 = (uint)(((uint)(local_a0.d[uVar8 >> 4 & 0xfffffff] >> ((char)uVar8 * '\x04' & 0x3fU)) &
                     0xf) << 6 == uVar3);
      lVar1 = (long)(int)uVar4 + -1;
      lVar6 = -(long)(int)uVar4;
      auVar9._8_4_ = (int)lVar1;
      auVar9._0_8_ = lVar1;
      auVar9._12_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar11._8_4_ = (int)lVar6;
      auVar11._0_8_ = lVar6;
      auVar11._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar13 = *(undefined1 (*) [16])(lVar2 + -0x30 + uVar3) & auVar11 | auVar13 & auVar9;
      auVar14 = auVar11 & *(undefined1 (*) [16])(lVar2 + -0x20 + uVar3) | auVar14 & auVar9;
      lVar1 = (long)(int)uVar4 + -1;
      lVar6 = -(long)(int)uVar4;
      auVar10._8_4_ = (int)lVar1;
      auVar10._0_8_ = lVar1;
      auVar10._12_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar12._8_4_ = (int)lVar6;
      auVar12._0_8_ = lVar6;
      auVar12._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar16 = *(undefined1 (*) [16])(lVar2 + -0x10 + uVar3) & auVar12 | auVar16 & auVar10;
      auVar15 = auVar12 & *(undefined1 (*) [16])(lVar2 + uVar3) | auVar15 & auVar10;
      uVar3 = uVar3 + 0x40;
    } while (uVar3 != 0x400);
    local_e8 = auVar13;
    local_d8 = auVar14;
    local_c8 = auVar16;
    local_b8 = auVar15;
    secp256k1_ge_from_storage(&local_80,(secp256k1_ge_storage *)local_e8);
    secp256k1_gej_add_ge(r,r,&local_80);
    uVar8 = uVar8 + 1;
    lVar2 = lVar2 + 0x400;
  } while (uVar8 != 0x40);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    int bits = ECMULT_GEN_PREC_BITS;
    int g = ECMULT_GEN_PREC_G(bits);
    int n = ECMULT_GEN_PREC_N(bits);

    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int i, j, n_i;
    
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (i = 0; i < n; i++) {
        n_i = secp256k1_scalar_get_bits(&gnb, i * bits, bits);
        for (j = 0; j < g; j++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (https://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &secp256k1_ecmult_gen_prec_table[i][j], j == n_i);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    n_i = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}